

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O3

char * curlx_dyn_take(dynbuf *s,size_t *plen)

{
  char *pcVar1;
  
  pcVar1 = s->bufr;
  *plen = s->leng;
  s->bufr = (char *)0x0;
  s->leng = 0;
  s->allc = 0;
  return pcVar1;
}

Assistant:

char *Curl_dyn_take(struct dynbuf *s, size_t *plen)
{
  char *ptr = s->bufr;
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  *plen = s->leng;
  s->bufr = NULL;
  s->leng = 0;
  s->allc = 0;
  return ptr;
}